

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O1

void load_resets(FILE *fp)

{
  ushort uVar1;
  EXIT_DATA *pEVar2;
  bool bVar3;
  byte bVar4;
  short sVar5;
  int iVar6;
  RESET_DATA *pRVar7;
  ROOM_INDEX_DATA *pRVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  size_t sVar12;
  short *args;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  char letter;
  byte local_3d;
  int local_3c;
  CLogger *local_38;
  
  if (area_last == (AREA_DATA_conflict *)0x0) {
    fmt_02._M_str = "Load_resets: no #AREA seen yet.";
    fmt_02._M_len = 0x1f;
    CLogger::Error<>((CLogger *)std::runtime_error::runtime_error,fmt_02);
LAB_0012d1b9:
    exit(1);
  }
  iVar11 = 0;
  local_38 = (CLogger *)std::runtime_error::runtime_error;
  local_3c = 0;
  do {
    bVar4 = fread_letter(fp);
    local_3d = bVar4;
    if (bVar4 == 0x53) {
      bVar3 = true;
      goto LAB_0012d182;
    }
    if (bVar4 == 0x2a) {
      fread_to_eol(fp);
      goto LAB_0012d180;
    }
    pRVar7 = (RESET_DATA *)operator_new(0x18);
    pRVar7->command = bVar4;
    fread_number(fp);
    iVar6 = fread_number(fp);
    pRVar7->arg1 = (short)iVar6;
    iVar6 = fread_number(fp);
    pRVar7->arg2 = (short)iVar6;
    sVar5 = 0;
    if ((local_3d != 0x47) && (local_3d != 0x52)) {
      iVar6 = fread_number(fp);
      sVar5 = (short)iVar6;
    }
    pRVar7->arg3 = sVar5;
    if ((local_3d == 0x50) || (local_3d == 0x4d)) {
      iVar6 = fread_number(fp);
      sVar5 = (short)iVar6;
    }
    else {
      sVar5 = 0;
    }
    pRVar7->arg4 = sVar5;
    fread_to_eol(fp);
    if (0xe < local_3d - 0x44) {
switchD_0012cf44_caseD_46:
      fmt_01._M_str = "Load_resets: bad command \'{}\'.";
      fmt_01._M_len = 0x1e;
      CLogger::Error<char&>((CLogger *)std::runtime_error::runtime_error,fmt_01,(char *)&local_3d);
      goto LAB_0012d1b9;
    }
    args = &pRVar7->arg3;
    switch((uint)local_3d) {
    case 0x44:
      pRVar8 = get_room_index(0);
      uVar1 = pRVar7->arg2;
      if (((((long)(short)uVar1 < 0) || (pRVar8 == (ROOM_INDEX_DATA *)0x0)) || (5 < uVar1)) ||
         ((pEVar2 = pRVar8->exit[(short)uVar1], pEVar2 == (EXIT_DATA *)0x0 ||
          (uVar9 = pEVar2->exit_info[0], (uVar9 & 1) == 0)))) {
        pcVar10 = "Load_resets: \'D\': exit {} not door.";
        sVar12 = 0x23;
LAB_0012d1b1:
        fmt_00._M_str = pcVar10;
        fmt_00._M_len = sVar12;
        CLogger::Error<short&>((CLogger *)std::runtime_error::runtime_error,fmt_00,&pRVar7->arg2);
        goto LAB_0012d1b9;
      }
      sVar5 = *args;
      if (sVar5 != 0) {
        if (sVar5 == 2) {
          uVar9 = uVar9 | 6;
        }
        else {
          if (sVar5 != 1) {
            fmt._M_str = "Load_resets: \'D\': bad \'locks\': {}.";
            fmt._M_len = 0x22;
            CLogger::Warn<short&>(local_38,fmt,args);
            break;
          }
          uVar9 = uVar9 | 2;
        }
        pEVar2->exit_info[0] = uVar9;
      }
      break;
    case 0x45:
    case 0x47:
      get_obj_index(0);
      pRVar8 = get_room_index(0);
      if (pRVar8 != (ROOM_INDEX_DATA *)0x0) {
        if (pRVar8->reset_last == (RESET_DATA *)0x0) {
          pRVar8->reset_first = pRVar7;
          pRVar8->reset_last = pRVar7;
        }
        else {
          pRVar8->reset_last->next = pRVar7;
          pRVar8->reset_last = pRVar7;
          pRVar7->next = (RESET_DATA *)0x0;
        }
        top_reset = top_reset + 1;
        local_3c = iVar11;
      }
      break;
    default:
      goto switchD_0012cf44_caseD_46;
    case 0x4d:
      get_mob_index(0);
      pRVar8 = get_room_index(0);
      if (pRVar8 != (ROOM_INDEX_DATA *)0x0) {
        if (pRVar8->reset_last == (RESET_DATA *)0x0) {
          pRVar8->reset_first = pRVar7;
          pRVar8->reset_last = pRVar7;
        }
        else {
          pRVar8->reset_last->next = pRVar7;
          pRVar8->reset_last = pRVar7;
          pRVar7->next = (RESET_DATA *)0x0;
        }
        top_reset = top_reset + 1;
        iVar11 = (int)*args;
      }
      break;
    case 0x4f:
      get_obj_index(0);
      pRVar8 = get_room_index(0);
      if (pRVar8 != (ROOM_INDEX_DATA *)0x0) {
        if (pRVar8->reset_last == (RESET_DATA *)0x0) {
          pRVar8->reset_first = pRVar7;
          pRVar8->reset_last = pRVar7;
        }
        else {
          pRVar8->reset_last->next = pRVar7;
          pRVar8->reset_last = pRVar7;
          pRVar7->next = (RESET_DATA *)0x0;
        }
        top_reset = top_reset + 1;
        local_3c = (int)*args;
      }
      break;
    case 0x50:
      get_obj_index(0);
      pRVar8 = get_room_index(0);
      goto LAB_0012d029;
    case 0x52:
      pRVar8 = get_room_index(0);
      if (6 < (ushort)pRVar7->arg2) {
        pcVar10 = "Load_resets: \'R\': bad exit {}.";
        sVar12 = 0x1e;
        goto LAB_0012d1b1;
      }
LAB_0012d029:
      if (pRVar8 != (ROOM_INDEX_DATA *)0x0) {
        if (pRVar8->reset_last == (RESET_DATA *)0x0) {
          pRVar8->reset_first = pRVar7;
          pRVar8->reset_last = pRVar7;
        }
        else {
          pRVar8->reset_last->next = pRVar7;
          pRVar8->reset_last = pRVar7;
          pRVar7->next = (RESET_DATA *)0x0;
        }
        top_reset = top_reset + 1;
      }
    }
    pRVar7->next = (RESET_DATA *)0x0;
    top_reset = top_reset + 1;
LAB_0012d180:
    bVar3 = false;
LAB_0012d182:
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void load_resets(FILE *fp)
{
	RESET_DATA *pReset;
	int iLastRoom = 0;
	int iLastObj = 0;

	if (!area_last)
	{
		RS.Logger.Error("Load_resets: no #AREA seen yet.");
		exit(1);
	}

	for (;;)
	{
		ROOM_INDEX_DATA *pRoomIndex;
		EXIT_DATA *pexit = nullptr;
		char letter;
		/*
		OBJ_INDEX_DATA *temp_index;
		int temp;
		*/

		letter = fread_letter(fp);

		if (letter == 'S')
			break;

		if (letter == '*')
		{
			fread_to_eol(fp);
			continue;
		}

		pReset = new RESET_DATA;
		pReset->command = letter;

		/* if_flag */ fread_number(fp);

		pReset->arg1 = fread_number(fp);
		pReset->arg2 = fread_number(fp);
		pReset->arg3 = (letter == 'G' || letter == 'R') ? 0 : fread_number(fp);
		pReset->arg4 = (letter == 'P' || letter == 'M') ? fread_number(fp) : 0;

		/*
		pReset->arg4 = (letter == 'P' || letter == 'M')
			? ((temp == 0) ? 1 : fread_number(fp))
			: 0;
		*/

		fread_to_eol(fp);

		/*
		 * Validate parameters.
		 * We're calling the index functions for the side effect.
		 */
		switch (letter)
		{
			case 'M':
				get_mob_index(pReset->arg1);

				/*
				get_room_index(pReset->arg3);
				*/

				pRoomIndex = get_room_index(pReset->arg3);

				if (pRoomIndex)
				{
					new_reset(pRoomIndex, pReset);
					iLastRoom = pReset->arg3;
				}

				break;
			case 'O':
				/*
				temp_index = get_obj_index(pReset->arg1);
				temp_index->reset_num++;
				get_room_index(pReset->arg3);
				*/

				get_obj_index(pReset->arg1);

				pRoomIndex = get_room_index(pReset->arg3);

				if (pRoomIndex)
				{
					new_reset(pRoomIndex, pReset);
					iLastObj = pReset->arg3;
				}

				break;
			case 'P':
				/*
				temp_index = get_obj_index(pReset->arg1);
				temp_index->reset_num++;
				get_obj_index(pReset->arg3);
				*/

				get_obj_index(pReset->arg1);
				
				pRoomIndex = get_room_index(iLastObj);

				if (pRoomIndex)
					new_reset(pRoomIndex, pReset);

				break;
			case 'G':
			case 'E':
				/*
				temp_index = get_obj_index(pReset->arg1);
				temp_index->reset_num++;
				*/

				get_obj_index(pReset->arg1);

				pRoomIndex = get_room_index(iLastRoom);

				if (pRoomIndex)
				{
					new_reset(pRoomIndex, pReset);
					iLastObj = iLastRoom;
				}

				break;
			case 'D':
				pRoomIndex = get_room_index(pReset->arg1);

				if (pReset->arg2 < 0
					|| pReset->arg2 > 5
					|| !pRoomIndex
					|| !(pexit = pRoomIndex->exit[pReset->arg2])
					|| !IS_SET(pexit->exit_info, EX_ISDOOR))
				{
					RS.Logger.Error("Load_resets: 'D': exit {} not door.", pReset->arg2);
					exit(1);
				}

				/*
				if (pReset->arg3 < 0 || pReset->arg3 > 2)
				{
					RS.Logger.Error("Load_resets: 'D': bad 'locks': %d.", pReset->arg3);
					exit(1);
				}
				*/

				switch (pReset->arg3)
				{
					case 0:
						break;
					case 1:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						break;
					case 2:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						SET_BIT(pexit->exit_info, EX_LOCKED);
						break;
					default:
						RS.Logger.Warn("Load_resets: 'D': bad 'locks': {}.", pReset->arg3);
						break;
				}

				break;
			case 'R':
				pRoomIndex = get_room_index(pReset->arg1);

				if (pReset->arg2 < 0 || pReset->arg2 > 6)
				{
					RS.Logger.Error("Load_resets: 'R': bad exit {}.", pReset->arg2);
					exit(1);
				}

				if (pRoomIndex)
					new_reset(pRoomIndex, pReset);

				break;
			default:
				RS.Logger.Error("Load_resets: bad command '{}'.", letter);
				exit(1);
				break;
		}

		/*
		if (area_last->reset_first == nullptr)
			area_last->reset_first = pReset;
	
		if (area_last->reset_last != nullptr)
			area_last->reset_last->next	= pReset;

		area_last->reset_last = pReset;
		*/
		pReset->next = nullptr;
		top_reset++;
	}
}